

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

STBase * __thiscall jbcoin::STObject::getPField(STObject *this,SField *field,bool createOkay)

{
  bool bVar1;
  int offset;
  size_t sVar2;
  int index;
  bool createOkay_local;
  SField *field_local;
  STObject *this_local;
  
  offset = getFieldIndex(this,field);
  if (offset == -1) {
    if ((createOkay) && (bVar1 = isFree(this), bVar1)) {
      sVar2 = emplace_back<jbcoin::detail::defaultObject_t&,jbcoin::SField_const&>
                        (this,(defaultObject_t *)&jbcoin::detail::defaultObject,field);
      this_local = (STObject *)getPIndex(this,(int)sVar2);
    }
    else {
      this_local = (STObject *)0x0;
    }
  }
  else {
    this_local = (STObject *)getPIndex(this,offset);
  }
  return &this_local->super_STBase;
}

Assistant:

STBase* STObject::getPField (SField const& field, bool createOkay)
{
    int index = getFieldIndex (field);

    if (index == -1)
    {
        if (createOkay && isFree ())
            return getPIndex(emplace_back(detail::defaultObject, field));

        return nullptr;
    }

    return getPIndex (index);
}